

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

void __thiscall
tcmalloc::DefaultPagesAllocator::UnMapPages(DefaultPagesAllocator *this,void *region,size_t size)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (cached_pagesize()::pagesize == 0) {
    iVar1 = getpagesize();
    cached_pagesize()::pagesize = (ulong)iVar1;
  }
  if ((ulong)region % cached_pagesize()::pagesize == 0) {
    if (size % cached_pagesize()::pagesize == 0) {
      iVar1 = munmap(region,size);
      if (iVar1 == 0) {
        return;
      }
      pcVar3 = 
      "Check failed: munmap_result == 0: LowLevelAlloc::DeleteArena: munmap failed address\n";
      uVar2 = 0x54;
    }
    else {
      pcVar3 = "Check failed: size % pagesize == 0: empty arena has non-page-aligned size\n";
      uVar2 = 0x4a;
    }
  }
  else {
    pcVar3 = 
    "Check failed: reinterpret_cast<intptr_t>(region) % pagesize == 0: empty arena has non-page-aligned block\n"
    ;
    uVar2 = 0x69;
  }
  syscall(1,2,pcVar3,uVar2);
  abort();
}

Assistant:

void DefaultPagesAllocator::UnMapPages(void *region, size_t size) {
  size_t pagesize = cached_pagesize();
  (void)pagesize;

  RAW_CHECK(reinterpret_cast<intptr_t>(region) % pagesize == 0,
            "empty arena has non-page-aligned block");
  RAW_CHECK(size % pagesize == 0,
            "empty arena has non-page-aligned size");

  int munmap_result = munmap(region, size);
  RAW_CHECK(munmap_result == 0,
            "LowLevelAlloc::DeleteArena: munmap failed address");
}